

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::trim_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,trim_type do_trim)

{
  value_type *__x;
  bool *pbVar1;
  tree_type<cs::token_base_*> *ptVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  instance_type *this_00;
  element_type *peVar4;
  value_type *pvVar5;
  pointer pbVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  token_base **pptVar12;
  token_base *ptVar13;
  token_id *this_01;
  undefined4 extraout_var;
  iterator iVar14;
  undefined4 extraout_var_00;
  token_base *ptVar15;
  statement_base *stmt;
  undefined4 extraout_var_01;
  undefined8 *puVar16;
  object_method *this_02;
  token_value *ptVar17;
  internal_error *this_03;
  runtime_error *this_04;
  compile_error *pcVar18;
  _func_int **pp_Var19;
  tree_type<cs::token_base_*> *ptVar20;
  string *name;
  iterator size;
  function *pfVar21;
  undefined4 uVar22;
  tree_type<cs::token_base_*> *tree_2;
  size_t sVar23;
  _func_int **pp_Var24;
  value_type *__x_00;
  tree_type<cs::token_base_*> *ptVar25;
  value_type *pvVar26;
  tree_type<cs::token_base_*> *tree_1;
  _func_int **pp_Var27;
  function *__args;
  tree_type<cs::token_base_*> *lst;
  initializer_list<cs::tree_type<cs::token_base_*>_> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<cs::statement_base_*> __l_01;
  iterator it_local;
  var lambda;
  bool local_254;
  function func;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  token_base *token;
  string decl;
  size_t local_158;
  any local_150;
  any local_148;
  _func_int **local_140;
  size_t local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  size_t sStack_128;
  context_t local_120;
  _func_int **local_110;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d0;
  _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  local_80;
  
  pfVar21 = (function *)&it_local;
  if (it.mData == (tree_node *)0x0) {
    return;
  }
  ptVar20 = tree;
  it_local = it;
  pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  token = *pptVar12;
  if (token == (token_base *)0x0) {
    return;
  }
  iVar11 = (*token->_vptr_token_base[2])();
  if (0xb < iVar11) {
    if (iVar11 == 0xc) {
      if (do_trim == no_expr_fold) {
        return;
      }
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      ptVar13 = *pptVar12 + 1;
      trim_expr(this,(tree_type<cs::token_base_*> *)ptVar13,
                (tree_node *)(*pptVar12)[1]._vptr_token_base,do_trim);
      tree_type<cs::token_base_*>::merge(tree,it_local,(tree_type<cs::token_base_*> *)ptVar13);
      return;
    }
    if (iVar11 == 0xe) {
      ptVar20 = (tree_type<cs::token_base_*> *)token[2]._vptr_token_base;
      ptVar2 = (tree_type<cs::token_base_*> *)token[4]._vptr_token_base;
      if (ptVar20 == ptVar2) {
        return;
      }
      ptVar25 = (tree_type<cs::token_base_*> *)token[3]._vptr_token_base;
      sVar23 = token[3].line_num;
      do {
        trim_expr(this,ptVar20,ptVar20->mRoot,do_trim);
        ptVar20 = ptVar20 + 1;
        if (ptVar20 == ptVar25) {
          ptVar20 = *(tree_type<cs::token_base_*> **)(sVar23 + 8);
          sVar23 = sVar23 + 8;
          ptVar25 = ptVar20 + 0x40;
        }
      } while (ptVar20 != ptVar2);
      return;
    }
    goto switchD_0012d8d1_caseD_f;
  }
  if (iVar11 != 3) {
    if (iVar11 == 4) {
      if (do_trim == no_this_deduce) {
        return;
      }
      name = (string *)(token + 3);
      bVar10 = domain_manager::exist_record
                         (&(((((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->instance).
                             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_runtime_type).storage,name);
      if (bVar10) {
        return;
      }
      bVar10 = domain_manager::exist_record_in_struct
                         (&(((((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->instance).
                             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_runtime_type).storage,name);
      if (!bVar10) {
        return;
      }
      ptVar13 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)name);
      ptVar13->line_num = 1;
      ptVar13->_vptr_token_base = (_func_int **)&PTR__token_base_0025dd80;
      *(undefined4 *)&ptVar13[1]._vptr_token_base = 0xe;
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar12 = ptVar13;
      size = it_local;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,it_local,&token);
      iVar14 = it_local;
      this_01 = (token_id *)token_base::operator_new((token_base *)0x50,(size_t)size.mData);
      func.mMatch = true;
      func._17_3_ = 0x736968;
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
      func._20_4_ = func._20_4_ & 0xffffff00;
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      token_id::token_id(this_01,(string *)&func);
      decl._M_dataplus._M_p = (pointer)this_01;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_id*>
                ((tree_type<cs::token_base*> *)tree,iVar14,(token_id **)&decl);
      if (func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)&func.mMatch) {
        operator_delete(func.mContext.
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        CONCAT44(func._20_4_,func._16_4_) + 1);
      }
      tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,it_local,&token);
      return;
    }
    goto switchD_0012d8d1_caseD_f;
  }
  iVar11 = *(int *)&token[1]._vptr_token_base;
  switch(iVar11) {
  case 0xd:
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,no_expr_fold);
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,no_expr_fold);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar15 = *pptVar12;
    if (ptVar13 == (token_base *)0x0 && ptVar15 == (token_base *)0x0) {
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar12 = (token_base *)0x0;
      return;
    }
    if (ptVar13 == (token_base *)0x0) {
      ptVar13 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)tree);
      ptVar13->_vptr_token_base = (_func_int **)0x0;
      ptVar13->line_num = 0;
      ptVar13[1]._vptr_token_base = (_func_int **)0x0;
      ptVar13[1].line_num = 0;
      ptVar13[2]._vptr_token_base = (_func_int **)0x0;
      ptVar13[2].line_num = 0;
      ptVar13[3]._vptr_token_base = (_func_int **)0x0;
      ptVar13[3].line_num = 0;
      ptVar13[4]._vptr_token_base = (_func_int **)0x0;
      ptVar13[4].line_num = 0;
      ptVar13[5]._vptr_token_base = (_func_int **)0x0;
      ptVar13[5].line_num = 0;
      ptVar13->line_num = 1;
      ptVar13->_vptr_token_base = (_func_int **)&PTR__token_parallel_0025df60;
      std::
      _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::_M_initialize_map((_Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                           *)(ptVar13 + 1),0);
    }
    else {
      iVar11 = (*ptVar13->_vptr_token_base[2])(ptVar13);
      if (iVar11 != 0xf) {
        ptVar13 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)tree);
        iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
        iVar11 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar14.mData,(EVP_PKEY_CTX *)0x0)
        ;
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(extraout_var_00,iVar11);
        __l._M_len = 1;
        __l._M_array = (iterator)&func;
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)&local_80,__l,(allocator_type *)&decl);
        ptVar13->line_num = 1;
        ptVar13->_vptr_token_base = (_func_int **)&PTR__token_parallel_0025df60;
        std::
        _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ::_Deque_base((_Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                       *)(ptVar13 + 1),&local_80);
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        ~deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)&local_80);
        tree_type<cs::token_base_*>::destroy
                  ((tree_node *)
                   func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (ptVar15 != (token_base *)0x0) {
      iVar11 = (*ptVar15->_vptr_token_base[2])(ptVar15);
      if (iVar11 == 0xf) {
        __x_00 = (value_type *)ptVar15[2]._vptr_token_base;
        pvVar5 = (value_type *)ptVar15[4]._vptr_token_base;
        if (__x_00 != pvVar5) {
          pvVar26 = (value_type *)ptVar15[3]._vptr_token_base;
          sVar23 = ptVar15[3].line_num;
          do {
            std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::push_back((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                         *)(ptVar13 + 1),__x_00);
            __x_00 = __x_00 + 1;
            if (__x_00 == pvVar26) {
              __x_00 = *(value_type **)(sVar23 + 8);
              sVar23 = sVar23 + 8;
              pvVar26 = __x_00 + 0x40;
            }
          } while (__x_00 != pvVar5);
        }
      }
      else {
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
        std::deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>::
        emplace_back<cs::tree_type<cs::token_base*>::iterator>
                  ((deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>
                    *)(ptVar13 + 1),(iterator *)&func);
      }
    }
    ptVar20 = (tree_type<cs::token_base_*> *)ptVar13[2]._vptr_token_base;
    ptVar2 = (tree_type<cs::token_base_*> *)ptVar13[4]._vptr_token_base;
    if (ptVar20 != ptVar2) {
      ptVar25 = (tree_type<cs::token_base_*> *)ptVar13[3]._vptr_token_base;
      sVar23 = ptVar13[3].line_num;
      do {
        trim_expr(this,ptVar20,ptVar20->mRoot,do_trim);
        ptVar20 = ptVar20 + 1;
        if (ptVar20 == ptVar25) {
          ptVar20 = *(tree_type<cs::token_base_*> **)(sVar23 + 8);
          sVar23 = sVar23 + 8;
          ptVar25 = ptVar20 + 0x40;
        }
      } while (ptVar20 != ptVar2);
    }
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar12 = ptVar13;
    return;
  case 0xe:
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if ((*pptVar12 != (token_base *)0x0) &&
       (iVar11 = (*(*pptVar12)->_vptr_token_base[2])(), iVar11 == 4)) {
      return;
    }
    pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&func.mMatch;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&func,"Wrong grammar for dot expression.","");
    compile_error::compile_error(pcVar18,(string *)&func);
    __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x28:
  case 0x2f:
  case 0x30:
    break;
  case 0x11:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 == (token_base *)0x0) {
LAB_0012eed3:
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for assign expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    decl._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&decl);
    if (*pptVar12 == (token_base *)0x0) goto LAB_0012eed3;
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    ptVar20 = tree;
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    iVar11 = (*(*pptVar12)->_vptr_token_base[2])();
    if (iVar11 == 0xf) {
      ptVar13 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar20);
      ptVar13->line_num = 1;
      ptVar13->_vptr_token_base = (_func_int **)&PTR__token_base_0025dd80;
      *(undefined4 *)&ptVar13[1]._vptr_token_base = 0x35;
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar12 = ptVar13;
    }
    goto LAB_0012e215;
  case 0x19:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for not expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x1d:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    if ((ptVar13 == (token_base *)0x0) ||
       (ptVar13->_vptr_token_base != (_func_int **)&PTR__token_base_0025dd80)) {
      ptVar13 = (token_base *)0x0;
    }
    if ((ptVar13 == (token_base *)0x0) || (*(int *)&ptVar13[1]._vptr_token_base != 0x1c)) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for choice expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    iVar14 = tree_type<cs::token_base_*>::iterator::left((iterator *)&func);
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pfVar21 = &func;
    goto LAB_0012e4a5;
  case 0x25:
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if ((((this->inside_lambda != true) || (ptVar13 != (token_base *)0x0)) ||
        (ptVar13 = *pptVar12, ptVar13 == (token_base *)0x0)) ||
       (iVar11 = (*ptVar13->_vptr_token_base[2])(ptVar13), iVar11 != 0xd)) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for lambda expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_0012e422;
  case 0x27:
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (((ptVar13 != (token_base *)0x0) && (*pptVar12 != (token_base *)0x0)) &&
       (iVar11 = (*(*pptVar12)->_vptr_token_base[2])(), iVar11 == 0xd)) {
      return;
    }
    pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&func.mMatch;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&func,"Wrong syntax for function call.","");
    compile_error::compile_error(pcVar18,(string *)&func);
    __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
  case 0x29:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for typeid expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2a:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for addr expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2b:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for new expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2c:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for gcnew expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
LAB_0012e215:
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    goto LAB_0012e4ad;
  case 0x2d:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 == (token_base *)0x0) {
LAB_0012ee7d:
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for arrow expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    decl._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&decl);
    if (*pptVar12 == (token_base *)0x0) goto LAB_0012ee7d;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_198);
    iVar11 = (*(*pptVar12)->_vptr_token_base[2])();
    if (iVar11 != 4) goto LAB_0012ee7d;
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    goto LAB_0012e4ad;
  case 0x2e:
    this->inside_lambda = true;
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    this->inside_lambda = false;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,no_this_deduce);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (((ptVar13 == (token_base *)0x0) || (*pptVar12 == (token_base *)0x0)) ||
       (iVar11 = (*ptVar13->_vptr_token_base[2])(ptVar13), iVar11 != 0xd)) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for lambda expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pp_Var19 = ptVar13[2]._vptr_token_base;
    pp_Var27 = ptVar13[4]._vptr_token_base;
    if (pp_Var19 == pp_Var27) {
      local_254 = false;
    }
    else {
      pp_Var24 = ptVar13[3]._vptr_token_base;
      local_158 = ptVar13[3].line_num;
      local_254 = false;
      local_110 = pp_Var27;
      do {
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*pp_Var19;
        pfVar21 = &func;
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
        if (*pptVar12 == (token_base *)0x0) {
          this_03 = (internal_error *)__cxa_allocate_exception(0x28);
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&func.mMatch;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&func,"Null pointer accessed.","");
          internal_error::internal_error(this_03,(string *)&func);
          __cxa_throw(this_03,&internal_error::typeinfo,internal_error::~internal_error);
        }
        try_fix_this_deduction((compiler_type *)pfVar21,(tree_node *)*pp_Var19);
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*pp_Var19;
        pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
        iVar11 = (*(*pptVar12)->_vptr_token_base[2])();
        if (iVar11 == 4) {
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*pp_Var19;
          pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
          pbVar6 = local_198.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          __x = (value_type *)(*pptVar12 + 3);
          if (local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*pptVar12)[3].line_num;
            pfVar21 = (function *)
                      local_198.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              __n = (pfVar21->mContext).
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
              if ((__n == p_Var3) &&
                 ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                  (iVar11 = bcmp((pfVar21->mContext).
                                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,(__x->_M_dataplus)._M_p,(size_t)__n), iVar11 == 0)))) {
                pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
                func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)&func.mMatch;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&func,"Redefinition of function argument.","");
                compile_error::compile_error(pcVar18,(string *)&func);
                __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
              }
              pfVar21 = (function *)&(pfVar21->mDecl)._M_string_length;
            } while (pfVar21 != (function *)pbVar6);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_198,__x);
          pp_Var27 = local_110;
        }
        else {
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*pp_Var19;
          pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
          iVar11 = (*(*pptVar12)->_vptr_token_base[2])();
          if (iVar11 != 5) {
            pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
            func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&func.mMatch;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&func,"Unexpected element in function argument list.","");
            compile_error::compile_error(pcVar18,(string *)&func);
            __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
          }
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*pp_Var19;
          pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
          if (local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
            func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&func.mMatch;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&func,"Redefinition of function argument(Multi-define of vargs).",
                       "");
            compile_error::compile_error(pcVar18,(string *)&func);
            __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
          }
          local_254 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_198,(value_type *)(*pptVar12 + 1));
        }
        pp_Var19 = pp_Var19 + 1;
        if (pp_Var19 == pp_Var24) {
          pp_Var19 = *(_func_int ***)(local_158 + 8);
          local_158 = local_158 + 8;
          pp_Var24 = pp_Var19 + 0x40;
        }
      } while (pp_Var19 != pp_Var27);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    pbVar1 = &func.mMatch;
    func.mMatch = true;
    func._17_3_ = 0x666c65;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
    func._20_4_ = func._20_4_ & 0xffffff00;
    pfVar21 = &func;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pbVar1;
    bVar10 = find_id_ref(iVar14,(string *)pfVar21);
    if (func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)pbVar1) {
      pfVar21 = (function *)(CONCAT44(func._20_4_,func._16_4_) + 1);
      operator_delete(func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)pfVar21);
    }
    if ((~bVar10 & 1U) == 0 && local_254 == false) {
      func.mMatch = true;
      func._17_3_ = 0x666c65;
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
      func._20_4_ = func._20_4_ & 0xffffff00;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&func;
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pbVar1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&decl,__l_00,(allocator_type *)&lambda);
      if (func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)pbVar1) {
        operator_delete(func.mContext.
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        CONCAT44(func._20_4_,func._16_4_) + 1);
      }
      pfVar21 = (function *)
                ((long)local_198.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&decl,(size_type)pfVar21);
      pbVar6 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __args = (function *)
                 local_198.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar11 = std::__cxx11::string::compare((char *)__args);
          if (iVar11 == 0) {
            this_04 = (runtime_error *)__cxa_allocate_exception(0x28);
            func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&func.mMatch;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&func,"Overwrite the default argument \"self\".","");
            runtime_error::runtime_error(this_04,(string *)&func);
            __cxa_throw(this_04,&runtime_error::typeinfo,runtime_error::~runtime_error);
          }
          pfVar21 = __args;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&decl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          __args = (function *)&(__args->mDecl)._M_string_length;
        } while (__args != (function *)pbVar6);
      }
      uVar9 = decl.field_2._M_allocated_capacity;
      sVar8 = decl._M_string_length;
      _Var7._M_p = decl._M_dataplus._M_p;
      decl.field_2._M_allocated_capacity =
           (size_type)
           local_198.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      decl._M_dataplus._M_p =
           (pointer)local_198.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      decl._M_string_length =
           (size_type)
           local_198.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var7._M_p;
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar8;
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar9;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&decl);
    }
    stmt = (statement_base *)statement_base::operator_new((statement_base *)0x28,(size_t)pfVar21);
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    sVar23 = 0;
    iVar11 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar14.mData,(EVP_PKEY_CTX *)0x0);
    peVar4 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var3 = (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    puVar16 = (undefined8 *)token_base::operator_new((token_base *)0x10,sVar23);
    sVar23 = token->line_num;
    puVar16[1] = sVar23;
    *puVar16 = &PTR__token_base_0025e3a0;
    (stmt->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4
    ;
    (stmt->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    stmt->line_num = sVar23;
    stmt->_vptr_statement_base = (_func_int **)&PTR__statement_return_0025f610;
    stmt[1]._vptr_statement_base = (_func_int **)CONCAT44(extraout_var_01,iVar11);
    decl._M_dataplus._M_p = (pointer)&decl.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&decl,"function [lambda](","");
    pbVar6 = local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)&decl);
    }
    else {
      pfVar21 = (function *)
                local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar4 = (pfVar21->mContext).
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&func.mMatch;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&func,peVar4,
                   (long)&((pfVar21->mContext).
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar4);
        std::__cxx11::string::append((char *)&func);
        std::__cxx11::string::_M_append
                  ((char *)&decl,
                   (ulong)func.mContext.
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)&func.mMatch) {
          operator_delete(func.mContext.
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          CONCAT44(func._20_4_,func._16_4_) + 1);
        }
        pfVar21 = (function *)&(pfVar21->mDecl)._M_string_length;
      } while (pfVar21 != (function *)pbVar6);
      std::__cxx11::string::pop_back();
      decl._M_dataplus._M_p[decl._M_string_length - 1] = ')';
    }
    local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,decl._M_dataplus._M_p,
               decl._M_dataplus._M_p + decl._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,&local_198);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&lambda;
    lambda.mDat = (proxy *)stmt;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               __l_01,(allocator_type *)&local_150);
    cs::function::function
              (&func,&local_120,&local_108,stmt,&local_e8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               local_254,true);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (bVar10) {
      local_150.mDat = (proxy *)0x0;
      cs_impl::any::make_protect<cs::callable,cs::function&>(&local_148,&func);
      cs_impl::any::make<cs::object_method,cs_impl::any,cs_impl::any>(&lambda,&local_150,&local_148)
      ;
      cs_impl::any::recycle(&local_148);
      cs_impl::any::recycle(&local_150);
      this_02 = cs_impl::any::val<cs::object_method>(&lambda);
      if ((this_02->object).mDat != lambda.mDat) {
        cs_impl::any::recycle(&this_02->object);
        if (lambda.mDat != (proxy *)0x0) {
          (lambda.mDat)->refcount = (lambda.mDat)->refcount + 1;
        }
        (this_02->object).mDat = lambda.mDat;
      }
      cs_impl::any::protect(&lambda);
      ptVar17 = new_value(this,&lambda);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    }
    else {
      cs_impl::any::make_protect<cs::callable,cs::function&>(&lambda,&func);
      ptVar17 = new_value(this,&lambda);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    }
    *pptVar12 = &ptVar17->super_token_base;
    cs_impl::any::recycle(&lambda);
    cs::function::~function(&func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl._M_dataplus._M_p != &decl.field_2) {
      operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    return;
  case 0x31:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,no_this_deduce);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
    if ((ptVar13 == (token_base *)0x0) ||
       (iVar11 = (*ptVar13->_vptr_token_base[2])(ptVar13), iVar11 != 4)) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    domain_manager::add_record
              (&(((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,(string *)(ptVar13 + 3));
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    goto LAB_0012e35c;
  case 0x32:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,no_this_deduce);
    this_00 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    instance_type::check_declar_var(this_00,iVar14,true);
    goto LAB_0012e407;
  case 0x33:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar14,no_this_deduce);
LAB_0012e407:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar13 = *pptVar12;
LAB_0012e422:
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar12 = ptVar13;
    return;
  case 0x34:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 == (token_base *)0x0) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      ptVar13 = *pptVar12;
      if ((ptVar13 == (token_base *)0x0) ||
         (iVar11 = (*ptVar13->_vptr_token_base[2])(ptVar13), iVar11 != 4)) {
        pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&func.mMatch;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&func,"Wrong grammar for vargs expression.","");
        compile_error::compile_error(pcVar18,(string *)&func);
        __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
      }
      ptVar15 = (token_base *)token_base::operator_new((token_base *)0x30,(size_t)ptVar20);
      local_140 = (_func_int **)&local_130;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,ptVar13[3]._vptr_token_base,
                 ptVar13[3].line_num + (long)ptVar13[3]._vptr_token_base);
      ptVar15->line_num = 1;
      ptVar15->_vptr_token_base = (_func_int **)&PTR__token_vargs_0025e328;
      ptVar15[1]._vptr_token_base = (_func_int **)(ptVar15 + 2);
      if (local_140 == (_func_int **)&local_130) {
        ptVar15[2]._vptr_token_base = (_func_int **)CONCAT71(uStack_12f,local_130);
        ptVar15[2].line_num = sStack_128;
      }
      else {
        ptVar15[1]._vptr_token_base = local_140;
        ptVar15[2]._vptr_token_base = (_func_int **)CONCAT71(uStack_12f,local_130);
      }
      ptVar15[1].line_num = local_138;
      local_138 = 0;
      local_130 = 0;
      local_140 = (_func_int **)&local_130;
      pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar12 = ptVar15;
      if (local_140 == (_func_int **)&local_130) {
        return;
      }
      operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
      return;
    }
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar12 != (token_base *)0x0) {
      pcVar18 = (compile_error *)__cxa_allocate_exception(0x28);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&func.mMatch;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&func,"Wrong grammar for vargs expression.","");
      compile_error::compile_error(pcVar18,(string *)&func);
      __cxa_throw(pcVar18,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar14,do_trim);
    ptVar13 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)tree);
    iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    iVar11 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar14.mData,(EVP_PKEY_CTX *)0x0);
    ptVar13->line_num = 1;
    ptVar13->_vptr_token_base = (_func_int **)&PTR__token_expand_0025de08;
    ptVar13[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar11);
    pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
LAB_0012e35c:
    *pptVar12 = ptVar13;
    return;
  default:
    if (iVar11 == 3) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar12 == (token_base *)0x0) {
        uVar22 = 0x30;
LAB_0012e450:
        ptVar13 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar20);
        ptVar13->line_num = 1;
        ptVar13->_vptr_token_base = (_func_int **)&PTR__token_base_0025dd80;
        *(undefined4 *)&ptVar13[1]._vptr_token_base = uVar22;
        pptVar12 = tree_type<cs::token_base_*>::iterator::data(&it_local);
        *pptVar12 = ptVar13;
      }
    }
    else if (iVar11 == 5) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar12 == (token_base *)0x0) {
        uVar22 = 0x2f;
        goto LAB_0012e450;
      }
    }
  }
switchD_0012d8d1_caseD_f:
  iVar14 = tree_type<cs::token_base_*>::iterator::left(&it_local);
  trim_expr(this,tree,iVar14,do_trim);
LAB_0012e4a5:
  iVar14 = tree_type<cs::token_base_*>::iterator::right((iterator *)pfVar21);
LAB_0012e4ad:
  trim_expr(this,tree,iVar14,do_trim);
  return;
}

Assistant:

void
	compiler_type::trim_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, trim_type do_trim)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			if (do_trim != trim_type::no_this_deduce) {
				const std::string &id = static_cast<token_id *>(token)->get_id();
				if (!context->instance->storage.exist_record(id) &&
				        context->instance->storage.exist_record_in_struct(id)) {
					it.data() = new token_signal(signal_types::dot_);
					tree.emplace_left_left(it, token);
					tree.emplace_left_left(it, new token_id("this"));
					tree.emplace_right_right(it, token);
				}
			}
			return;
		}
		case token_types::expr: {
			if (do_trim != trim_type::no_expr_fold) {
				tree_type<token_base *> &t = static_cast<token_expr *>(it.data())->get_tree();
				trim_expression(t, do_trim);
				tree.merge(it, t);
			}
			return;
		}
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array())
				trim_expression(tree, do_trim);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::addr_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for addr expression.");
				break;
			case signal_types::new_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				break;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				trim_expr(tree, it.right(), do_trim);
				return;
				break;
			case signal_types::typeid_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for typeid expression.");
				break;
			case signal_types::not_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for not expression.");
				break;
			case signal_types::sub_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::minus_);
				break;
			case signal_types::mul_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::escape_);
				break;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				trim_expr(tree, it.left(), do_trim);
				if (it.left().data()->get_type() == token_types::parallel)
					it.data() = new token_signal(signal_types::bind_);
				trim_expr(tree, it.right(), do_trim);
				return;
			case signal_types::com_: {
				trim_expr(tree, it.left(), trim_type::no_expr_fold);
				trim_expr(tree, it.right(), trim_type::no_expr_fold);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr && rptr == nullptr)
					it.data() = nullptr;
				else {
					token_parallel *parallel_list = nullptr;
					if (lptr != nullptr && lptr->get_type() == token_types::parallel)
						parallel_list = static_cast<token_parallel *>(lptr);
					else if (lptr != nullptr)
						parallel_list = new token_parallel({tree_type<token_base *>(it.left())});
					else
						parallel_list = new token_parallel();
					if (rptr != nullptr && rptr->get_type() == token_types::parallel)
						for (auto &tree: static_cast<token_parallel *>(rptr)->get_parallel())
							parallel_list->get_parallel().push_back(tree);
					else if (rptr != nullptr)
						parallel_list->get_parallel().emplace_back(it.right());
					for (auto &lst: parallel_list->get_parallel())
						trim_expr(lst, lst.root(), do_trim);
					it.data() = parallel_list;
				}
				return;
			}
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right().left(), do_trim);
				trim_expr(tree, it.right().right(), do_trim);
				return;
			}
			case signal_types::vardef_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for variable declaration.");
				context->instance->storage.add_record(static_cast<token_id *>(rptr)->get_id());
				it.data() = rptr;
				return;
			}
			case signal_types::varchk_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				context->instance->check_declar_var(it.right(), true);
				it.data() = it.right().data();
				return;
			}
			case signal_types::varprt_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				it.data() = it.right().data();
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				trim_expr(tree, it.left(), do_trim);
				return;
			case signal_types::dot_: {
				trim_expr(tree, it.left(), do_trim);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				return;
			}
			case signal_types::fcall_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				return;
			}
			case signal_types::vargs_: {
				if (it.left().data() == nullptr) {
					token_base *rptr = it.right().data();
					if (rptr == nullptr || rptr->get_type() != token_types::id)
						throw compile_error("Wrong grammar for vargs expression.");
					it.data() = new token_vargs(static_cast<token_id *>(rptr)->get_id());
				}
				else {
					if (it.right().data() != nullptr)
						throw compile_error("Wrong grammar for vargs expression.");
					trim_expr(tree, it.left(), do_trim);
					it.data() = new token_expand(tree_type<token_base *>(it.left()));
				}
				return;
			}
			case signal_types::emb_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (!inside_lambda || lptr != nullptr || rptr == nullptr ||
				        rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				it.data() = rptr;
				return;
			}
			case signal_types::lambda_: {
				inside_lambda = true;
				trim_expr(tree, it.left(), do_trim);
				inside_lambda = false;
				token_base *lptr = it.left().data();
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || lptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				std::vector<std::string> args;
				bool is_vargs = false;
				for (auto &item: static_cast<token_arglist *>(lptr)->get_arglist()) {
					if (item.root().data() == nullptr)
						throw internal_error("Null pointer accessed.");
					try_fix_this_deduction(item.root());
					if (item.root().data()->get_type() == token_types::id) {
						const std::string &str = static_cast<token_id *>(item.root().data())->get_id();
						for (auto &it: args)
							if (it == str)
								throw compile_error("Redefinition of function argument.");
						args.push_back(str);
					}
					else if (item.root().data()->get_type() == token_types::vargs) {
						const std::string &str = static_cast<token_vargs *>(item.root().data())->get_id();
						if (!args.empty())
							throw compile_error("Redefinition of function argument(Multi-define of vargs).");
						args.push_back(str);
						is_vargs = true;
					}
					else
						throw compile_error("Unexpected element in function argument list.");
				}
				bool find_self_ref = find_id_ref(it.right(), "self");
				if (!is_vargs && find_self_ref) {
					std::vector<std::string> new_args{"self"};
					new_args.reserve(args.size());
					for (auto &name: args) {
						if (name != "self")
							new_args.emplace_back(std::move(name));
						else
							throw runtime_error("Overwrite the default argument \"self\".");
					}
					std::swap(new_args, args);
				}
				statement_base *ret = new statement_return(tree_type<token_base *>(it.right()), context,
				        new token_endline(token->get_line_num()));
#ifdef CS_DEBUGGER
				std::string decl="function [lambda](";
				if(args.size()!=0) {
					for(auto& it:args)
						decl+=it+", ";
					decl.pop_back();
					decl[decl.size()-1]=')';
				}
				else
					decl+=")";
				function func(context, decl, ret, args, std::deque<statement_base *> {ret}, is_vargs, true);
#else
				function func(context, args, std::deque<statement_base *> {ret}, is_vargs, true);
#endif
				if (find_self_ref) {
					var lambda = var::make<object_method>(var(), var::make_protect<callable>(func));
					lambda.val<object_method>().object = lambda;
					lambda.protect();
					it.data() = new_value(lambda);
				}
				else
					it.data() = new_value(var::make_protect<callable>(func));
				return;
			}
			}
		}
		}
		trim_expr(tree, it.left(), do_trim);
		trim_expr(tree, it.right(), do_trim);
	}